

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_bool32 ma_dr_flac__seek_to_pcm_frame__brute_force(ma_dr_flac *pFlac,ma_uint64 pcmFrameIndex)

{
  bool bVar1;
  bool bVar2;
  ma_bool32 mVar3;
  ma_result mVar4;
  ma_uint64 mVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ma_uint8 streaminfoBitsPerSample;
  uint uVar9;
  ma_dr_flac_frame *unaff_R12;
  uint uVar10;
  ulong uVar11;
  char cVar12;
  
  uVar8 = pFlac->currentPCMFrame;
  if (pcmFrameIndex < uVar8) {
    mVar3 = ma_dr_flac__seek_to_byte(&pFlac->bs,pFlac->firstFLACFramePosInBytes);
    unaff_R12 = &pFlac->currentFLACFrame;
    memset(unaff_R12,0,0xa8);
    if (mVar3 == 0) {
      return 0;
    }
    streaminfoBitsPerSample = pFlac->bitsPerSample;
  }
  else {
    bVar1 = true;
    if ((uVar8 != 0) || ((pFlac->currentFLACFrame).pcmFramesRemaining != 0)) goto LAB_00157ece;
    streaminfoBitsPerSample = pFlac->bitsPerSample;
  }
  mVar3 = ma_dr_flac__read_next_flac_frame_header
                    (&pFlac->bs,streaminfoBitsPerSample,&(pFlac->currentFLACFrame).header);
  bVar1 = false;
  if (mVar3 == 0) {
    return 0;
  }
  uVar8 = 0;
LAB_00157ece:
  do {
    uVar10 = (uint)unaff_R12;
    mVar5 = (pFlac->currentFLACFrame).header.pcmFrameNumber;
    if (mVar5 == 0) {
      mVar5 = (ulong)pFlac->maxBlockSizeInPCMFrames *
              (ulong)(pFlac->currentFLACFrame).header.flacFrameNumber;
    }
    lVar6 = (pFlac->currentFLACFrame).header.blockSizeInPCMFrames + mVar5;
    lVar7 = lVar6 + -1;
    if (lVar6 == 0) {
      lVar7 = 0;
    }
    uVar11 = (uVar8 - mVar5) + lVar7 + 1;
    if (pcmFrameIndex < uVar11) {
      if (bVar1) {
LAB_00157f2b:
        mVar5 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,pcmFrameIndex - uVar8);
        uVar10 = (uint)(mVar5 == pcmFrameIndex - uVar8);
        bVar2 = false;
      }
      else {
        mVar4 = ma_dr_flac__decode_flac_frame(pFlac);
        if (mVar4 == MA_CRC_MISMATCH) {
          bVar2 = true;
        }
        else {
          if (mVar4 == MA_SUCCESS) goto LAB_00157f2b;
          bVar2 = false;
          uVar10 = 0;
        }
      }
      cVar12 = '\x01';
      uVar11 = uVar8;
      uVar9 = uVar10;
      if (bVar2) goto LAB_00157f83;
    }
    else {
      if (bVar1) {
        uVar11 = uVar8 + (pFlac->currentFLACFrame).pcmFramesRemaining;
        (pFlac->currentFLACFrame).pcmFramesRemaining = 0;
        uVar9 = uVar10;
      }
      else {
        mVar4 = ma_dr_flac__seek_flac_frame(pFlac);
        if (mVar4 == MA_SUCCESS) {
          cVar12 = '\0';
        }
        else if (mVar4 == MA_CRC_MISMATCH) {
          cVar12 = '\x04';
          uVar11 = uVar8;
        }
        else {
          uVar10 = 0;
          cVar12 = '\x01';
          uVar11 = uVar8;
        }
        uVar9 = uVar10;
        if (cVar12 != '\0') {
          bVar1 = false;
          uVar8 = uVar11;
          if (cVar12 == '\x04') goto LAB_00157f83;
          goto LAB_00157faa;
        }
      }
      bVar1 = false;
      if (pFlac->totalPCMFrameCount == pcmFrameIndex) {
        cVar12 = '\x01';
        uVar10 = 1;
        uVar8 = uVar11;
        if (uVar11 == pFlac->totalPCMFrameCount) goto LAB_00157faa;
      }
LAB_00157f83:
      uVar10 = uVar9;
      mVar3 = ma_dr_flac__read_next_flac_frame_header
                        (&pFlac->bs,pFlac->bitsPerSample,&(pFlac->currentFLACFrame).header);
      cVar12 = mVar3 == 0;
      uVar8 = uVar11;
      if ((bool)cVar12) {
        uVar10 = 0;
      }
    }
LAB_00157faa:
    unaff_R12 = (ma_dr_flac_frame *)(ulong)uVar10;
    if (cVar12 != '\0') {
      return uVar10;
    }
  } while( true );
}

Assistant:

static ma_bool32 ma_dr_flac__seek_to_pcm_frame__brute_force(ma_dr_flac* pFlac, ma_uint64 pcmFrameIndex)
{
    ma_bool32 isMidFrame = MA_FALSE;
    ma_uint64 runningPCMFrameCount;
    MA_DR_FLAC_ASSERT(pFlac != NULL);
    if (pcmFrameIndex >= pFlac->currentPCMFrame) {
        runningPCMFrameCount = pFlac->currentPCMFrame;
        if (pFlac->currentPCMFrame == 0 && pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
                return MA_FALSE;
            }
        } else {
            isMidFrame = MA_TRUE;
        }
    } else {
        runningPCMFrameCount = 0;
        if (!ma_dr_flac__seek_to_first_frame(pFlac)) {
            return MA_FALSE;
        }
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
    for (;;) {
        ma_uint64 pcmFrameCountInThisFLACFrame;
        ma_uint64 firstPCMFrameInFLACFrame = 0;
        ma_uint64 lastPCMFrameInFLACFrame = 0;
        ma_dr_flac__get_pcm_frame_range_of_current_flac_frame(pFlac, &firstPCMFrameInFLACFrame, &lastPCMFrameInFLACFrame);
        pcmFrameCountInThisFLACFrame = (lastPCMFrameInFLACFrame - firstPCMFrameInFLACFrame) + 1;
        if (pcmFrameIndex < (runningPCMFrameCount + pcmFrameCountInThisFLACFrame)) {
            ma_uint64 pcmFramesToDecode = pcmFrameIndex - runningPCMFrameCount;
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__decode_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, pcmFramesToDecode) == pcmFramesToDecode;
            }
        } else {
            if (!isMidFrame) {
                ma_result result = ma_dr_flac__seek_to_next_flac_frame(pFlac);
                if (result == MA_SUCCESS) {
                    runningPCMFrameCount += pcmFrameCountInThisFLACFrame;
                } else {
                    if (result == MA_CRC_MISMATCH) {
                        goto next_iteration;
                    } else {
                        return MA_FALSE;
                    }
                }
            } else {
                runningPCMFrameCount += pFlac->currentFLACFrame.pcmFramesRemaining;
                pFlac->currentFLACFrame.pcmFramesRemaining = 0;
                isMidFrame = MA_FALSE;
            }
            if (pcmFrameIndex == pFlac->totalPCMFrameCount && runningPCMFrameCount == pFlac->totalPCMFrameCount) {
                return MA_TRUE;
            }
        }
    next_iteration:
        if (!ma_dr_flac__read_next_flac_frame_header(&pFlac->bs, pFlac->bitsPerSample, &pFlac->currentFLACFrame.header)) {
            return MA_FALSE;
        }
    }
}